

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CS248::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  double *pdVar5;
  XMLElement *pXVar6;
  CameraInfo *pCVar7;
  undefined8 *puVar8;
  MaterialInfo *material_1;
  XMLElement *e_material_1;
  string material_id_1;
  XMLElement *e_instance_material_1;
  SphereInfo *sphere;
  MaterialInfo *material;
  XMLElement *e_material;
  string material_id;
  XMLElement *e_instance_material;
  PolymeshInfo *polymesh;
  LightInfo *light;
  CameraInfo *camera;
  XMLElement *e_geometry;
  XMLElement *e_light;
  XMLElement *e_camera;
  XMLElement *e_child;
  Matrix4x4 transform_save;
  stringstream ss_3;
  string s_3;
  Matrix4x4 m_2;
  stringstream ss_2;
  string s_2;
  Matrix4x4 m_1;
  string sid;
  stringstream ss_1;
  string s_1;
  Matrix4x4 m;
  Matrix4x4 mat;
  stringstream ss;
  string s;
  string name;
  XMLElement *e;
  Node node;
  int j;
  XMLElement *in_stack_ffffffffffffedf8;
  int i;
  Node *in_stack_ffffffffffffee00;
  value_type *in_stack_ffffffffffffee08;
  Node *in_stack_ffffffffffffee10;
  Matrix4x4 *in_stack_ffffffffffffee18;
  Matrix4x4 *in_stack_ffffffffffffee20;
  Matrix4x4 *in_stack_ffffffffffffee30;
  Matrix4x4 *in_stack_ffffffffffffee38;
  allocator *paVar9;
  SphereInfo *sphere_00;
  LightInfo *in_stack_ffffffffffffee60;
  undefined4 in_stack_fffffffffffff058;
  _Ios_Openmode in_stack_fffffffffffff05c;
  XMLElement *in_stack_fffffffffffff060;
  string local_eb8 [32];
  Node *local_e98;
  undefined1 local_e89 [40];
  allocator local_e61;
  string local_e60 [32];
  XMLElement *local_e40;
  CameraInfo *local_e38;
  undefined1 local_e29 [33];
  undefined8 *local_e08;
  string local_e00 [32];
  XMLElement *local_de0;
  allocator local_dd1;
  string local_dd0 [39];
  allocator local_da9;
  string local_da8 [32];
  XMLElement *local_d88;
  CameraInfo *local_d80;
  allocator local_d71;
  string local_d70 [32];
  CameraInfo *local_d50;
  CameraInfo *local_d48;
  allocator local_d39;
  string local_d38 [32];
  XMLElement *local_d18;
  allocator local_d09;
  string local_d08 [32];
  XMLElement *local_ce8;
  allocator local_cd9;
  string local_cd8 [32];
  XMLElement *local_cb8;
  allocator local_ca9;
  string local_ca8 [32];
  XMLElement *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  XMLElement *pXStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [40];
  LightInfo *in_stack_fffffffffffff4a8;
  XMLElement *in_stack_fffffffffffff4b0;
  MaterialInfo *in_stack_fffffffffffff4d8;
  XMLElement *in_stack_fffffffffffff4e0;
  stringstream local_b00 [399];
  allocator local_971;
  string local_970 [160];
  undefined1 local_8d0 [128];
  stringstream local_850 [200];
  PolymeshInfo *in_stack_fffffffffffff878;
  XMLElement *in_stack_fffffffffffff880;
  allocator local_6c1;
  string local_6c0 [160];
  undefined1 local_620 [135];
  allocator local_599;
  string local_598 [32];
  stringstream local_578 [399];
  undefined1 local_3e9 [165];
  int local_344;
  undefined1 local_340 [128];
  stringstream local_2c0 [399];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  XMLElement *local_e8;
  string local_d0 [32];
  string local_b0 [32];
  CameraInfo *local_90;
  undefined8 local_88 [15];
  
  Node::Node(in_stack_ffffffffffffee10);
  pcVar4 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)in_stack_ffffffffffffee08,(char *)in_stack_ffffffffffffee00,
                      (char *)in_stack_ffffffffffffedf8);
  std::__cxx11::string::operator=(local_d0,pcVar4);
  pcVar4 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)in_stack_ffffffffffffee08,(char *)in_stack_ffffffffffffee00,
                      (char *)in_stack_ffffffffffffedf8);
  std::__cxx11::string::operator=(local_b0,pcVar4);
  local_e8 = tinyxml2::XMLNode::FirstChildElement
                       ((XMLNode *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8);
  do {
    if (local_e8 == (XMLElement *)0x0) break;
    pcVar4 = tinyxml2::XMLElement::Name((XMLElement *)0x1e07d5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar4,&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    bVar2 = std::operator==(&in_stack_ffffffffffffee00->id,(char *)in_stack_ffffffffffffedf8);
    if (bVar2) {
      pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffedf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar4,&local_131);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_2c0,local_130,_Var3);
      Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee10);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee00,
                          (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                          (int)in_stack_ffffffffffffedf8);
      std::istream::operator>>((istream *)local_2c0,pdVar5);
      memcpy(local_88,local_340,0x80);
      local_344 = 3;
      std::__cxx11::stringstream::~stringstream(local_2c0);
      std::__cxx11::string::~string(local_130);
    }
    else {
      bVar2 = std::operator==(&in_stack_ffffffffffffee00->id,(char *)in_stack_ffffffffffffedf8);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee10);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffedf8);
        in_stack_fffffffffffff060 = (XMLElement *)local_3e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_3e9 + 1),pcVar4,(allocator *)in_stack_fffffffffffff060);
        std::allocator<char>::~allocator((allocator<char> *)local_3e9);
        in_stack_fffffffffffff05c = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream
                  (local_578,(string *)(local_3e9 + 1),in_stack_fffffffffffff05c);
        pcVar4 = tinyxml2::XMLElement::Attribute
                           ((XMLElement *)in_stack_ffffffffffffee08,
                            (char *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_598,pcVar4,&local_599);
        std::allocator<char>::~allocator((allocator<char> *)&local_599);
        pcVar4 = (char *)std::__cxx11::string::back();
        cVar1 = *pcVar4;
        j = (int)in_stack_ffffffffffffedf8;
        i = (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20);
        if (cVar1 == 'X') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee00,i,j);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
        }
        else if (cVar1 == 'Y') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee00,i,j);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
        }
        else if (cVar1 == 'Z') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee00,i,j);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee00,
                              (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                              (int)in_stack_ffffffffffffedf8);
          std::istream::operator>>((istream *)local_578,pdVar5);
        }
        Matrix4x4::operator*(in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
        memcpy(local_88,local_620,0x80);
        std::__cxx11::string::~string(local_598);
        std::__cxx11::stringstream::~stringstream(local_578);
        std::__cxx11::string::~string((string *)(local_3e9 + 1));
      }
      bVar2 = std::operator==(&in_stack_ffffffffffffee00->id,(char *)in_stack_ffffffffffffedf8);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee10);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffedf8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6c0,pcVar4,&local_6c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_850,local_6c0,_Var3);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_850,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_850,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_850,pdVar5);
        Matrix4x4::operator*(in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
        memcpy(local_88,local_8d0,0x80);
        std::__cxx11::stringstream::~stringstream(local_850);
        std::__cxx11::string::~string(local_6c0);
      }
      bVar2 = std::operator==(&in_stack_ffffffffffffee00->id,(char *)in_stack_ffffffffffffedf8);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee10);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffedf8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_970,pcVar4,&local_971);
        std::allocator<char>::~allocator((allocator<char> *)&local_971);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_b00,local_970,_Var3);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_b00,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_b00,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee00,
                            (int)((ulong)in_stack_ffffffffffffedf8 >> 0x20),
                            (int)in_stack_ffffffffffffedf8);
        std::istream::operator>>((istream *)local_b00,pdVar5);
        Matrix4x4::operator*(in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
        memcpy(local_88,local_b80,0x80);
        std::__cxx11::stringstream::~stringstream(local_b00);
        std::__cxx11::string::~string(local_970);
      }
      local_e8 = tinyxml2::XMLNode::NextSiblingElement
                           ((XMLNode *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8);
      local_344 = 0;
    }
    std::__cxx11::string::~string(local_108);
  } while (local_344 == 0);
  Matrix4x4::Matrix4x4(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  Matrix4x4::operator*(in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
  local_88[0xe] = local_c10;
  local_88[0xc] = local_c20;
  local_88[0xd] = uStack_c18;
  local_88[10] = local_c30;
  local_88[0xb] = uStack_c28;
  local_88[8] = local_c40;
  local_88[9] = uStack_c38;
  local_88[6] = local_c50;
  local_88[7] = uStack_c48;
  local_88[4] = local_c60;
  local_88[5] = uStack_c58;
  local_88[2] = local_c70;
  local_88[3] = uStack_c68;
  local_88[0] = local_c80;
  local_88[1] = uStack_c78;
  transform._112_8_ = local_c10;
  transform._120_8_ = pXStack_c08;
  transform._96_8_ = local_c20;
  transform._104_8_ = uStack_c18;
  transform._80_8_ = local_c30;
  transform._88_8_ = uStack_c28;
  transform._64_8_ = local_c40;
  transform._72_8_ = uStack_c38;
  transform._48_8_ = local_c50;
  transform._56_8_ = uStack_c48;
  transform._32_8_ = local_c60;
  transform._40_8_ = uStack_c58;
  transform._16_8_ = local_c70;
  transform._24_8_ = uStack_c68;
  transform._0_8_ = local_c80;
  transform._8_8_ = uStack_c78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"node",&local_ca9);
  pXVar6 = get_element(in_stack_fffffffffffff060,
                       (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  local_c88 = pXVar6;
  while (local_c88 != (XMLElement *)0x0) {
    parse_node(pXStack_c08);
    local_c88 = tinyxml2::XMLNode::NextSiblingElement
                          ((XMLNode *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8);
  }
  transform._112_8_ = local_b90;
  transform._120_8_ = uStack_b88;
  transform._96_8_ = local_ba0;
  transform._104_8_ = uStack_b98;
  transform._80_8_ = local_bb0;
  transform._88_8_ = uStack_ba8;
  transform._64_8_ = local_bc0;
  transform._72_8_ = uStack_bb8;
  transform._48_8_ = local_bd0;
  transform._56_8_ = uStack_bc8;
  transform._32_8_ = local_be0;
  transform._40_8_ = uStack_bd8;
  transform._16_8_ = local_bf0;
  transform._24_8_ = uStack_be8;
  transform._0_8_ = local_c00;
  transform._8_8_ = uStack_bf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd8,"instance_camera",&local_cd9);
  pXVar6 = get_element(in_stack_fffffffffffff060,
                       (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  local_cb8 = pXVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"instance_light",&local_d09);
  pXVar6 = get_element(in_stack_fffffffffffff060,
                       (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  local_ce8 = pXVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"instance_geometry",&local_d39);
  pXVar6 = get_element(in_stack_fffffffffffff060,
                       (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  local_d18 = pXVar6;
  if (local_cb8 == (XMLElement *)0x0) {
    if (local_ce8 == (XMLElement *)0x0) {
      if (pXVar6 != (XMLElement *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d70,"mesh",&local_d71);
        pXVar6 = get_element(in_stack_fffffffffffff060,
                             (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058)
                            );
        std::__cxx11::string::~string(local_d70);
        std::allocator<char>::~allocator((allocator<char> *)&local_d71);
        if (pXVar6 == (XMLElement *)0x0) {
          sphere_00 = (SphereInfo *)local_e29;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_e29 + 1),"extra",(allocator *)sphere_00);
          pXVar6 = get_element(in_stack_fffffffffffff060,
                               (string *)
                               CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
          std::__cxx11::string::~string((string *)(local_e29 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_e29);
          if (pXVar6 != (XMLElement *)0x0) {
            pCVar7 = (CameraInfo *)operator_new(0x58);
            *(undefined8 *)((long)&(pCVar7->super_Instance).name.field_2 + 8) = 0;
            (pCVar7->view_dir).x = 0.0;
            (pCVar7->super_Instance).name._M_string_length = 0;
            (pCVar7->super_Instance).name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&(pCVar7->super_Instance).id.field_2 + 8) = 0;
            *(undefined8 *)&(pCVar7->super_Instance).name = 0;
            (pCVar7->super_Instance).id._M_string_length = 0;
            (pCVar7->super_Instance).id.field_2._M_allocated_capacity = 0;
            *(undefined8 *)&pCVar7->super_Instance = 0;
            *(undefined8 *)&(pCVar7->super_Instance).id = 0;
            (pCVar7->view_dir).y = 0.0;
            SphereInfo::SphereInfo((SphereInfo *)0x1e2301);
            local_e38 = pCVar7;
            parse_sphere((XMLElement *)in_stack_ffffffffffffee60,sphere_00);
            paVar9 = &local_e61;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_e60,
                       "instance_geometry/bind_material/technique_common/instance_material",paVar9);
            pXVar6 = get_element(in_stack_fffffffffffff060,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
            std::__cxx11::string::~string(local_e60);
            std::allocator<char>::~allocator((allocator<char> *)&local_e61);
            local_e40 = pXVar6;
            if (pXVar6 != (XMLElement *)0x0) {
              pcVar4 = tinyxml2::XMLElement::Attribute
                                 ((XMLElement *)in_stack_ffffffffffffee08,
                                  (char *)in_stack_ffffffffffffee00,
                                  (char *)in_stack_ffffffffffffedf8);
              if (pcVar4 == (char *)0x0) {
                exit(1);
              }
              pcVar4 = tinyxml2::XMLElement::Attribute
                                 ((XMLElement *)in_stack_ffffffffffffee08,
                                  (char *)in_stack_ffffffffffffee00,
                                  (char *)in_stack_ffffffffffffedf8);
              in_stack_ffffffffffffee08 = (value_type *)(pcVar4 + 1);
              in_stack_ffffffffffffee10 = (Node *)local_e89;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_e89 + 1),(char *)in_stack_ffffffffffffee08,
                         (allocator *)in_stack_ffffffffffffee10);
              std::allocator<char>::~allocator((allocator<char> *)local_e89);
              std::__cxx11::string::string(local_eb8,(string *)(local_e89 + 1));
              in_stack_ffffffffffffee00 = (Node *)uri_find(&in_stack_ffffffffffffee10->id);
              std::__cxx11::string::~string(local_eb8);
              local_e98 = in_stack_ffffffffffffee00;
              if (in_stack_ffffffffffffee00 == (Node *)0x0) {
                exit(1);
              }
              puVar8 = (undefined8 *)operator_new(0x50);
              puVar8[8] = 0;
              puVar8[9] = 0;
              puVar8[6] = 0;
              puVar8[7] = 0;
              puVar8[4] = 0;
              puVar8[5] = 0;
              puVar8[2] = 0;
              puVar8[3] = 0;
              *puVar8 = 0;
              puVar8[1] = 0;
              MaterialInfo::MaterialInfo((MaterialInfo *)0x1e25c7);
              parse_material(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
              (local_e38->view_dir).y = (double)puVar8;
              std::__cxx11::string::~string((string *)(local_e89 + 1));
            }
            local_90 = local_e38;
          }
        }
        else {
          pCVar7 = (CameraInfo *)operator_new(0xb0);
          pCVar7[1].super_Instance.id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&pCVar7[1].super_Instance.id.field_2 + 8) = 0;
          *(undefined8 *)&pCVar7[1].super_Instance.id = 0;
          pCVar7[1].super_Instance.id._M_string_length = 0;
          pCVar7->nClip = 0.0;
          pCVar7->fClip = 0.0;
          *(undefined8 *)&pCVar7[1].super_Instance = 0;
          (pCVar7->up_dir).z = 0.0;
          pCVar7->hFov = 0.0;
          pCVar7->vFov = 0.0;
          (pCVar7->up_dir).x = 0.0;
          (pCVar7->up_dir).y = 0.0;
          (pCVar7->view_dir).y = 0.0;
          (pCVar7->view_dir).z = 0.0;
          *(undefined8 *)((long)&(pCVar7->super_Instance).name.field_2 + 8) = 0;
          (pCVar7->view_dir).x = 0.0;
          (pCVar7->super_Instance).name._M_string_length = 0;
          (pCVar7->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pCVar7->super_Instance).id.field_2 + 8) = 0;
          *(undefined8 *)&(pCVar7->super_Instance).name = 0;
          (pCVar7->super_Instance).id._M_string_length = 0;
          (pCVar7->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)&pCVar7->super_Instance = 0;
          *(undefined8 *)&(pCVar7->super_Instance).id = 0;
          PolymeshInfo::PolymeshInfo((PolymeshInfo *)in_stack_ffffffffffffee00);
          local_d80 = pCVar7;
          parse_polymesh(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_da8,"instance_geometry/bind_material/technique_common/instance_material",
                     &local_da9);
          pXVar6 = get_element(in_stack_fffffffffffff060,
                               (string *)
                               CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
          std::__cxx11::string::~string(local_da8);
          std::allocator<char>::~allocator((allocator<char> *)&local_da9);
          local_d88 = pXVar6;
          if (pXVar6 != (XMLElement *)0x0) {
            pcVar4 = tinyxml2::XMLElement::Attribute
                               ((XMLElement *)in_stack_ffffffffffffee08,
                                (char *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8)
            ;
            if (pcVar4 == (char *)0x0) {
              exit(1);
            }
            pcVar4 = tinyxml2::XMLElement::Attribute
                               ((XMLElement *)in_stack_ffffffffffffee08,
                                (char *)in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_dd0,pcVar4 + 1,&local_dd1);
            std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
            std::__cxx11::string::string(local_e00,local_dd0);
            pXVar6 = uri_find(&in_stack_ffffffffffffee10->id);
            std::__cxx11::string::~string(local_e00);
            local_de0 = pXVar6;
            if (pXVar6 == (XMLElement *)0x0) {
              exit(1);
            }
            puVar8 = (undefined8 *)operator_new(0x50);
            puVar8[8] = 0;
            puVar8[9] = 0;
            puVar8[6] = 0;
            puVar8[7] = 0;
            puVar8[4] = 0;
            puVar8[5] = 0;
            puVar8[2] = 0;
            puVar8[3] = 0;
            *puVar8 = 0;
            puVar8[1] = 0;
            MaterialInfo::MaterialInfo((MaterialInfo *)0x1e21db);
            local_e08 = puVar8;
            parse_material(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
            *(undefined8 **)((long)&local_d80[1].super_Instance.id.field_2 + 8) = local_e08;
            std::__cxx11::string::~string(local_dd0);
          }
          local_90 = local_d80;
        }
      }
    }
    else {
      pCVar7 = (CameraInfo *)operator_new(0xb8);
      LightInfo::LightInfo(in_stack_ffffffffffffee60);
      local_d50 = pCVar7;
      parse_light(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
      local_90 = local_d50;
    }
  }
  else {
    pCVar7 = (CameraInfo *)operator_new(0x88);
    (pCVar7->up_dir).z = 0.0;
    pCVar7->hFov = 0.0;
    pCVar7->vFov = 0.0;
    (pCVar7->up_dir).x = 0.0;
    (pCVar7->up_dir).y = 0.0;
    (pCVar7->view_dir).y = 0.0;
    (pCVar7->view_dir).z = 0.0;
    *(undefined8 *)((long)&(pCVar7->super_Instance).name.field_2 + 8) = 0;
    (pCVar7->view_dir).x = 0.0;
    (pCVar7->super_Instance).name._M_string_length = 0;
    (pCVar7->super_Instance).name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pCVar7->super_Instance).id.field_2 + 8) = 0;
    *(undefined8 *)&(pCVar7->super_Instance).name = 0;
    (pCVar7->super_Instance).id._M_string_length = 0;
    (pCVar7->super_Instance).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)&pCVar7->super_Instance = 0;
    *(undefined8 *)&(pCVar7->super_Instance).id = 0;
    pCVar7->nClip = 0.0;
    pCVar7->fClip = 0.0;
    CameraInfo::CameraInfo((CameraInfo *)in_stack_ffffffffffffee10);
    local_d48 = pCVar7;
    parse_camera(pXVar6,pCVar7);
    local_90 = local_d48;
  }
  std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::push_back
            ((vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *)
             in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  Node::~Node(in_stack_ffffffffffffee00);
  return;
}

Assistant:

void ColladaParser::parse_node(XMLElement* xml) {
  // create new node
  Node node = Node();

  // name & id
  node.id = xml->Attribute("id");
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {
    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {
      string s = e->GetText();
      stringstream ss(s);

      Matrix4x4 mat;
      ss >> mat(0, 0);
      ss >> mat(0, 1);
      ss >> mat(0, 2);
      ss >> mat(0, 3);
      ss >> mat(1, 0);
      ss >> mat(1, 1);
      ss >> mat(1, 2);
      ss >> mat(1, 3);
      ss >> mat(2, 0);
      ss >> mat(2, 1);
      ss >> mat(2, 2);
      ss >> mat(2, 3);
      ss >> mat(3, 0);
      ss >> mat(3, 1);
      ss >> mat(3, 2);
      ss >> mat(3, 3);

      node.transform = mat;
      break;
    }

    // transformation - rotate
    if (name == "rotate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1, 1);
          ss >> m(1, 2);
          ss >> m(2, 1);
          ss >> m(2, 2);
          break;
        case 'Y':
          ss >> m(0, 0);
          ss >> m(2, 0);
          ss >> m(0, 2);
          ss >> m(2, 2);
          break;
        case 'Z':
          ss >> m(0, 0);
          ss >> m(0, 1);
          ss >> m(1, 0);
          ss >> m(1, 1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;
    }

    // transformation - translate
    if (name == "translate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 3);
      ss >> m(1, 3);
      ss >> m(2, 3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 0);
      ss >> m(1, 1);
      ss >> m(1, 1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera = get_element(xml, "instance_camera");
  XMLElement* e_light = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera(e_camera, *camera);
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light(e_light, *light);
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {
      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {
      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;
    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}